

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void TPZEqnArray<std::complex<double>_>::main(void)

{
  complex<double> val;
  int iVar1;
  complex<double> *pcVar2;
  TPZFMatrix<std::complex<double>_> *b;
  DecomposeType decType;
  TPZFMatrix<std::complex<double>_> rhs2;
  TPZFMatrix<std::complex<double>_> rhs;
  TPZEqnArray<std::complex<double>_> Test;
  double rnd;
  int random;
  int j;
  int i;
  TPZFMatrix<std::complex<double>_> MatrixA;
  ofstream output;
  char filename [20];
  char *in_stack_ffffffffffffa9e8;
  undefined4 in_stack_ffffffffffffa9f0;
  int in_stack_ffffffffffffa9f4;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffaa00;
  complex<double> *in_stack_ffffffffffffaa08;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffaa10;
  char *in_stack_ffffffffffffaa18;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffaa20;
  undefined4 in_stack_ffffffffffffaa30;
  undefined4 in_stack_ffffffffffffaa34;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffaa40;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffaa48;
  int64_t in_stack_ffffffffffffaa50;
  int64_t in_stack_ffffffffffffaa58;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffaa60;
  DecomposeType in_stack_ffffffffffffaae4;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffaae8;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffaaf0;
  MatrixOutputFormat in_stack_ffffffffffffaedc;
  ostream *in_stack_ffffffffffffaee0;
  char *in_stack_ffffffffffffaee8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffaef0;
  int local_2bc;
  int local_2b8;
  undefined1 local_218 [512];
  char local_18 [24];
  
  std::operator<<((ostream *)&std::cout,"Entre o nome do Arquivo\n");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                  CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0),
                  in_stack_ffffffffffffa9e8);
  std::ofstream::ofstream(local_218,local_18,_S_app);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffaa60,in_stack_ffffffffffffaa58,in_stack_ffffffffffffaa50);
  for (local_2b8 = 0; local_2b8 < 10; local_2b8 = local_2b8 + 1) {
    for (local_2bc = local_2b8; local_2bc < 10; local_2bc = local_2bc + 1) {
      iVar1 = rand();
      in_stack_ffffffffffffaa18 = (char *)(((double)iVar1 * 10.0) / 2147483647.0);
      in_stack_ffffffffffffaa20 =
           (TPZEqnArray<std::complex<double>_> *)
           TPZFMatrix<std::complex<double>_>::operator()
                     (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                      (int64_t)in_stack_ffffffffffffaa00);
      std::complex<double>::operator=
                ((complex<double> *)in_stack_ffffffffffffaa20,(double)in_stack_ffffffffffffaa18);
      in_stack_ffffffffffffaa10 =
           (TPZFMatrix<std::complex<double>_> *)
           TPZFMatrix<std::complex<double>_>::operator()
                     (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                      (int64_t)in_stack_ffffffffffffaa00);
      in_stack_ffffffffffffaa08 =
           TPZFMatrix<std::complex<double>_>::operator()
                     (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                      (int64_t)in_stack_ffffffffffffaa00);
      *(_func_int ***)in_stack_ffffffffffffaa08->_M_value =
           (in_stack_ffffffffffffaa10->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
           super_TPZSavable._vptr_TPZSavable;
      *(int64_t *)(in_stack_ffffffffffffaa08->_M_value + 8) =
           (in_stack_ffffffffffffaa10->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
           fRow;
      if (local_2b8 == local_2bc) {
        in_stack_ffffffffffffaa00 =
             (TPZEqnArray<std::complex<double>_> *)
             TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                        (int64_t)in_stack_ffffffffffffaa00);
        std::complex<double>::operator=((complex<double> *)in_stack_ffffffffffffaa00,6000.0);
      }
    }
  }
  TPZMatrix<std::complex<double>_>::Print
            (in_stack_ffffffffffffaef0,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee0,
             in_stack_ffffffffffffaedc);
  TPZFMatrix<std::complex<double>_>::Decompose_Cholesky
            ((TPZFMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_ffffffffffffaa34,in_stack_ffffffffffffaa30));
  TPZMatrix<std::complex<double>_>::Print
            (in_stack_ffffffffffffaef0,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee0,
             in_stack_ffffffffffffaedc);
  TPZEqnArray(in_stack_ffffffffffffaa20);
  Reset((TPZEqnArray<std::complex<double>_> *)
        CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0));
  for (local_2b8 = 0; local_2b8 < 10; local_2b8 = local_2b8 + 1) {
    BeginEquation((TPZEqnArray<std::complex<double>_> *)
                  CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0),
                  (int)((ulong)in_stack_ffffffffffffa9e8 >> 0x20));
    for (local_2bc = local_2b8; local_2bc < 10; local_2bc = local_2bc + 1) {
      in_stack_ffffffffffffa9f4 = local_2bc;
      pcVar2 = TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                          (int64_t)in_stack_ffffffffffffaa00);
      val._M_value._8_8_ = in_stack_ffffffffffffaa10;
      val._M_value._0_8_ = in_stack_ffffffffffffaa08;
      AddTerm(in_stack_ffffffffffffaa00,(int)((ulong)pcVar2 >> 0x20),val);
    }
    EndEquation((TPZEqnArray<std::complex<double>_> *)0x1d6b950);
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffaa60,in_stack_ffffffffffffaa58,in_stack_ffffffffffffaa50);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffaa60,in_stack_ffffffffffffaa58,in_stack_ffffffffffffaa50);
  TPZFMatrix<std::complex<double>_>::Zero
            ((TPZFMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0));
  b = (TPZFMatrix<std::complex<double>_> *)
      TPZFMatrix<std::complex<double>_>::operator()
                (in_stack_ffffffffffffaa10,(int64_t)in_stack_ffffffffffffaa08,
                 (int64_t)in_stack_ffffffffffffaa00);
  std::complex<double>::operator=((complex<double> *)b,1.0);
  TPZFMatrix<std::complex<double>_>::operator=(in_stack_ffffffffffffaa48,in_stack_ffffffffffffaa40);
  Print(in_stack_ffffffffffffaa20,in_stack_ffffffffffffaa18,(ostream *)in_stack_ffffffffffffaa10);
  TPZFMatrix<std::complex<double>_>::Subst_Forward
            ((TPZFMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0),b);
  EqnForward(in_stack_ffffffffffffaaf0,in_stack_ffffffffffffaae8,in_stack_ffffffffffffaae4);
  TPZMatrix<std::complex<double>_>::Print
            (in_stack_ffffffffffffaef0,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee0,
             in_stack_ffffffffffffaedc);
  TPZMatrix<std::complex<double>_>::Print
            (in_stack_ffffffffffffaef0,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee0,
             in_stack_ffffffffffffaedc);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1d6ba82);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1d6ba8f);
  ~TPZEqnArray((TPZEqnArray<std::complex<double>_> *)
               CONCAT44(in_stack_ffffffffffffa9f4,in_stack_ffffffffffffa9f0));
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1d6baa9);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void TPZEqnArray<TVar>::main()
{
	char  filename[20];
	
	cout << "Entre o nome do Arquivo\n";
	cin >> filename;
	ofstream output(filename,ios::app);
	
	TPZFMatrix<TVar> MatrixA(10,10);
	int i, j; 
	for(i=0;i<10;i++) {
		for(j=i;j<10;j++) {
			int random = rand();
			double rnd = (random*10.)/RAND_MAX;
			MatrixA(i,j)=rnd;
			MatrixA(j,i)=MatrixA(i,j);
			if(i==j) MatrixA(i,j)=6000.;
		}
	}

	MatrixA.Print("Teste 1",std::cout);
	MatrixA.Decompose_Cholesky();
	MatrixA.Print("Decomposta",std::cout);
	
	TPZEqnArray<TVar> Test;
	Test.Reset();
	for(i=0;i<10;i++) {
		Test.BeginEquation(i);
		for(j=i;j<10;j++) {
			Test.AddTerm(j, MatrixA(i,j));
		}
		Test.EndEquation(); 
	}
	
	TPZFMatrix<TVar> rhs(10,1), rhs2(10,1);
	//Inicializar rhs:
	rhs.Zero();
	rhs(0,0) = 1.;
	rhs2=rhs;
	
	Test.Print("Result", cout);
	
	MatrixA.Subst_Forward(&rhs);
	DecomposeType decType = ECholesky;
	Test.EqnForward(rhs2, decType);
	
	rhs.Print("FMatrix Decomposition"); 
	rhs2.Print("FrontalMatrix Decomposition"); 
	
}